

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPackage.cpp
# Opt level: O0

PackageSymbol * slang::ast::builtins::createStdPackage(Compilation *c)

{
  PackageSymbol *pPVar1;
  Compilation *in_RDI;
  BumpAllocator *unaff_retaddr;
  Compilation *in_stack_00000020;
  Compilation *in_stack_00000030;
  PackageSymbol *pkg;
  Compilation *in_stack_00000260;
  Compilation *in_stack_00000510;
  Symbol *in_stack_ffffffffffffffa8;
  VariableLifetime *in_stack_ffffffffffffffd8;
  NetType *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  char (*in_stack_fffffffffffffff0) [4];
  Compilation *args;
  
  args = in_RDI;
  Compilation::getWireNetType(in_RDI);
  pPVar1 = BumpAllocator::
           emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,char_const(&)[4],slang::SourceLocation_const&,slang::ast::NetType_const&,slang::ast::VariableLifetime>
                     (unaff_retaddr,args,in_stack_fffffffffffffff0,
                      (SourceLocation *)CONCAT44(1,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  createProcessClass(in_stack_00000510);
  Scope::addMember((Scope *)in_RDI,in_stack_ffffffffffffffa8);
  createSemaphoreClass(in_stack_00000260);
  Scope::addMember((Scope *)in_RDI,in_stack_ffffffffffffffa8);
  createMailboxClass(in_stack_00000020);
  Scope::addMember((Scope *)in_RDI,in_stack_ffffffffffffffa8);
  createRandomizeFunc(in_stack_00000030);
  Scope::addMember((Scope *)in_RDI,in_stack_ffffffffffffffa8);
  createWeakReference(in_stack_00000020);
  Scope::addMember((Scope *)in_RDI,in_stack_ffffffffffffffa8);
  return pPVar1;
}

Assistant:

const PackageSymbol& createStdPackage(Compilation& c) {
    auto pkg = c.emplace<PackageSymbol>(c, "std", NL, c.getWireNetType(), VariableLifetime::Static);
    pkg->addMember(createProcessClass(c));
    pkg->addMember(createSemaphoreClass(c));
    pkg->addMember(createMailboxClass(c));
    pkg->addMember(createRandomizeFunc(c));
    pkg->addMember(createWeakReference(c));

    return *pkg;
}